

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

bool dxil_spv::emit_binary_instruction(Impl *impl,BinaryOperator *instruction)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  BinaryOps BVar5;
  uint uVar6;
  ValueKind VVar7;
  Id type_id;
  Id IVar8;
  Type *pTVar9;
  Value *pVVar10;
  Constant *pCVar11;
  APInt *pAVar12;
  uint64_t uVar13;
  LoggingCallback p_Var14;
  void *pvVar15;
  Operation *pOVar16;
  Builder *this;
  bool is_signed;
  Op op;
  char buffer [4096];
  Id local_1040;
  Id local_103c;
  initializer_list<unsigned_int> local_1038;
  undefined2 uStack_1028;
  char acStack_1026 [4086];
  
  BVar5 = LLVMBC::BinaryOperator::getOpcode(instruction);
  switch(BVar5) {
  case Add:
    op = OpIAdd;
    break;
  case FAdd:
    bVar4 = true;
    op = OpFAdd;
    goto LAB_00151f4b;
  case Sub:
    op = OpISub;
    break;
  case FSub:
    bVar4 = true;
    op = OpFSub;
    goto LAB_00151f4b;
  case Mul:
    op = OpIMul;
    break;
  case FMul:
    IVar8 = peephole_trivial_arithmetic_identity(impl,instruction,FDiv,true);
    if (IVar8 != 0) goto LAB_0015210b;
    bVar4 = true;
    op = OpFMul;
    goto LAB_00151f4b;
  case UDiv:
    op = OpUDiv;
    goto LAB_00151df8;
  case SDiv:
    op = OpSDiv;
    goto LAB_00151e57;
  case FDiv:
    IVar8 = peephole_trivial_arithmetic_identity(impl,instruction,FMul,false);
    if (IVar8 != 0) goto LAB_0015210b;
    bVar1 = false;
    bVar4 = true;
    op = OpFDiv;
    goto LAB_00151f52;
  case URem:
    op = OpUMod;
    goto LAB_00151df8;
  case SRem:
    op = OpSRem;
    goto LAB_00151e57;
  case FRem:
    bVar4 = true;
    op = OpFRem;
    goto LAB_00151f4b;
  case Shl:
    op = OpShiftLeftLogical;
    break;
  case LShr:
    op = OpShiftRightLogical;
LAB_00151df8:
    bVar1 = true;
    bVar4 = false;
    goto LAB_00151f52;
  case AShr:
    op = OpShiftRightArithmetic;
LAB_00151e57:
    bVar1 = true;
    bVar4 = false;
    is_signed = true;
    goto LAB_00151f54;
  case And:
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar9);
    op = (uint)(uVar6 != 1) * 0x20 + OpLogicalAnd;
    break;
  case Or:
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar9);
    op = OpBitwiseOr;
    if (uVar6 == 1) {
      op = OpLogicalOr;
    }
    break;
  case Xor:
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    uVar6 = LLVMBC::Type::getIntegerBitWidth(pTVar9);
    if (uVar6 == 1) {
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
      if (pVVar10 != (Value *)0x0) {
        pCVar11 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar10);
        VVar7 = LLVMBC::Value::get_value_kind((Value *)pCVar11);
        if (VVar7 != ConstantInt) goto LAB_00151ea8;
        pAVar12 = LLVMBC::Constant::getUniqueInteger(pCVar11);
        uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
        uVar6 = 1;
        if (uVar13 == 0) {
          op = OpLogicalNotEqual;
          break;
        }
LAB_00151edf:
        pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar6);
        IVar8 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
        if (IVar8 != 0) {
          pVVar10 = LLVMBC::Internal::resolve_proxy((Value *)instruction);
          VVar7 = LLVMBC::Value::get_value_kind(pVVar10);
          if (VVar7 == ConstantExpr) {
            pTVar9 = LLVMBC::Value::getType((Value *)instruction);
            type_id = Converter::Impl::get_type_id(impl,pTVar9,0);
            pOVar16 = Converter::Impl::allocate(impl,OpLogicalNot,type_id);
          }
          else {
            pOVar16 = Converter::Impl::allocate(impl,OpLogicalNot,(Value *)instruction);
          }
          Operation::add_id(pOVar16,IVar8);
          Converter::Impl::add(impl,pOVar16,false);
          IVar8 = pOVar16->id;
          goto LAB_0015210b;
        }
        bVar4 = false;
        op = OpLogicalNotEqual;
        goto LAB_00151f4b;
      }
LAB_00151ea8:
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      pCVar11 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar10)->super_Constant;
      uVar6 = 0;
      op = OpLogicalNotEqual;
      if (pCVar11 != (Constant *)0x0) {
        pAVar12 = LLVMBC::Constant::getUniqueInteger(pCVar11);
        uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
        if (uVar13 != 0) goto LAB_00151edf;
      }
    }
    else {
      op = OpBitwiseXor;
    }
    break;
  default:
    p_Var14 = get_thread_log_callback();
    if (p_Var14 == (LoggingCallback)0x0) {
      emit_binary_instruction();
    }
    else {
      uStack_1028 = 0x6570;
      builtin_strncpy(acStack_1026,"rator.\n",8);
      local_1038._M_array = (iterator)0x206e776f6e6b6e55;
      local_1038._M_len._0_2_ = 0x6962;
      local_1038._M_len._2_6_ = 0x6f207972616e;
      pvVar15 = get_thread_log_callback_userdata();
      (*p_Var14)(pvVar15,Error,(char *)&local_1038);
    }
    IVar8 = 0;
    goto LAB_0015210b;
  }
  bVar4 = false;
LAB_00151f4b:
  bVar1 = false;
LAB_00151f52:
  is_signed = false;
LAB_00151f54:
  IVar8 = 0;
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  bVar2 = instruction_is_undefined_value(pVVar10);
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar3 = instruction_is_undefined_value(pVVar10);
  if (bVar2 || bVar3) {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(uint)!bVar3);
    IVar8 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  }
  pVVar10 = LLVMBC::Internal::resolve_proxy((Value *)instruction);
  VVar7 = LLVMBC::Value::get_value_kind(pVVar10);
  if (VVar7 == ConstantExpr) {
    if (IVar8 != 0) goto LAB_0015210b;
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    IVar8 = Converter::Impl::get_type_id(impl,pTVar9,0);
    pOVar16 = Converter::Impl::allocate(impl,op,IVar8);
  }
  else {
    if (IVar8 != 0) {
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar8);
      IVar8 = 1;
      goto LAB_0015210b;
    }
    pOVar16 = Converter::Impl::allocate(impl,op,(Value *)instruction);
  }
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  if (bVar1) {
    IVar8 = build_naturally_extended_value(impl,pVVar10,is_signed);
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    local_103c = build_naturally_extended_value(impl,pVVar10,is_signed);
  }
  else {
    IVar8 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    local_103c = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  }
  local_1038._M_array = &local_1040;
  local_1038._M_len._0_2_ = 2;
  local_1038._M_len._2_6_ = 0;
  local_1040 = IVar8;
  Operation::add_ids(pOVar16,&local_1038);
  Converter::Impl::add(impl,pOVar16,false);
  if (bVar4) {
    if (((impl->options).force_precise != false) ||
       (bVar4 = LLVMBC::BinaryOperator::isFast(instruction), !bVar4)) {
      this = Converter::Impl::builder(impl);
      spv::Builder::addDecoration(this,pOVar16->id,DecorationNoContraction,-1);
    }
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar9,pOVar16->id,false);
  }
  IVar8 = pOVar16->id;
LAB_0015210b:
  return IVar8 != 0;
}

Assistant:

bool emit_binary_instruction(Converter::Impl &impl, const llvm::BinaryOperator *instruction)
{
	return emit_binary_instruction_impl(impl, instruction) != 0;
}